

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::NotNested(FlatBufferBuilderImpl<true> *this)

{
  FlatBufferBuilderImpl<true> *this_local;
  
  if (((this->nested ^ 0xffU) & 1) == 0) {
    __assert_fail("!nested",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x192,
                  "void flatbuffers::FlatBufferBuilderImpl<true>::NotNested() [Is64Aware = true]");
  }
  if (this->num_field_loc != 0) {
    __assert_fail("!num_field_loc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x194,
                  "void flatbuffers::FlatBufferBuilderImpl<true>::NotNested() [Is64Aware = true]");
  }
  return;
}

Assistant:

void NotNested() {
    // If you hit this, you're trying to construct a Table/Vector/String
    // during the construction of its parent table (between the MyTableBuilder
    // and table.Finish().
    // Move the creation of these sub-objects to above the MyTableBuilder to
    // not get this assert.
    // Ignoring this assert may appear to work in simple cases, but the reason
    // it is here is that storing objects in-line may cause vtable offsets
    // to not fit anymore. It also leads to vtable duplication.
    FLATBUFFERS_ASSERT(!nested);
    // If you hit this, fields were added outside the scope of a table.
    FLATBUFFERS_ASSERT(!num_field_loc);
  }